

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiger.cpp
# Opt level: O1

bool __thiscall
despot::Tiger::Step(Tiger *this,State *s,double random_num,ACT_TYPE action,double *reward,
                   OBS_TYPE *obs)

{
  OBS_TYPE OVar1;
  int iVar2;
  
  if ((uint)action < 2) {
    iVar2 = 10;
    if (*(int *)(s + 0x20) == action) {
      iVar2 = -100;
    }
    *reward = (double)iVar2;
    *(uint *)(s + 0x20) = (uint)(0.5 < random_num);
    OVar1 = 2;
  }
  else {
    *reward = -1.0;
    OVar1 = (OBS_TYPE)*(int *)(s + 0x20);
    if (0.85 < random_num) {
      OVar1 = (OBS_TYPE)(1 - *(int *)(s + 0x20));
    }
  }
  *obs = OVar1;
  return false;
}

Assistant:

bool Tiger::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	TigerState& state = static_cast<TigerState&>(s);
	bool terminal = false;

	if (action == LEFT || action == RIGHT) {
		reward = state.tiger_position != action ? 10 : -100;
		state.tiger_position = random_num <= 0.5 ? LEFT : RIGHT;
		obs = 2; // can use arbitary observation
	} else {
		reward = -1;
		if (random_num <= 1 - NOISE)
			obs = state.tiger_position;
		else
			obs = (LEFT + RIGHT - state.tiger_position);
	}
	return terminal;
}